

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O2

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,AngleBasis *angleBasis)

{
  allocator<char> local_59;
  string local_58;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"AngleBasisName",&local_59)
  ;
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_38,&local_58,&angleBasis->name,0);
  FileParse::operator>>(node,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"AngleBasisBlock",&local_59);
  FileParse::
  Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>::Child
            ((Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
              *)&local_38,&local_58,&angleBasis->blocks,0);
  FileParse::operator>>
            (node,(Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
                   *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node, BSDFData::AngleBasis & angleBasis)
    {
        node >> FileParse::Child{"AngleBasisName", angleBasis.name};
        node >> FileParse::Child{"AngleBasisBlock", angleBasis.blocks};

        return node;
    }